

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterators.hpp
# Opt level: O2

difference_type __thiscall
protozero::const_varint_iterator<int>::distance
          (const_varint_iterator<int> *this,const_varint_iterator<int> begin,
          const_varint_iterator<int> end)

{
  difference_type dVar1;
  
  if (this == (const_varint_iterator<int> *)0x0) {
    dVar1 = 0;
  }
  else {
    dVar1 = std::
            __count_if<char_const*,__gnu_cxx::__ops::_Iter_pred<protozero::const_varint_iterator<int>::distance(protozero::const_varint_iterator<int>,protozero::const_varint_iterator<int>)::_lambda(char)_1_>>
                      (this,begin.m_end,begin.m_end,end.m_data,end.m_end);
  }
  return dVar1;
}

Assistant:

static difference_type distance(const_varint_iterator begin, const_varint_iterator end) noexcept {
        // The "distance" between default initialized const_varint_iterator's
        // is always 0.
        if (!begin.m_data) {
            return 0;
        }
        // We know that each varint contains exactly one byte with the most
        // significant bit not set. We can use this to quickly figure out
        // how many varints there are without actually decoding the varints.
        return std::count_if(begin.m_data, end.m_data, [](char c) noexcept {
            return (static_cast<unsigned char>(c) & 0x80U) == 0;
        });
    }